

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theory_data.cpp
# Opt level: O1

void __thiscall Potassco::TheoryData::reset(TheoryData *this)

{
  void *pvVar1;
  void *pvVar2;
  Data *pDVar3;
  ulong uVar4;
  long lVar5;
  TheoryTerm *t;
  DestroyT local_29;
  
  uVar4 = (this->data_->terms).top >> 3 & 0xffffffff;
  if (uVar4 != 0) {
    t = (TheoryTerm *)(this->data_->terms).mem.beg_;
    lVar5 = uVar4 << 3;
    do {
      DestroyT::operator()(&local_29,t);
      t = t + 1;
      lVar5 = lVar5 + -8;
    } while (lVar5 != 0);
  }
  uVar4 = (this->data_->elems).top >> 3 & 0xffffffff;
  if (uVar4 != 0) {
    pvVar1 = (this->data_->elems).mem.beg_;
    lVar5 = 0;
    do {
      pvVar2 = *(void **)((long)pvVar1 + lVar5);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2);
      }
      lVar5 = lVar5 + 8;
    } while (uVar4 * 8 != lVar5);
  }
  uVar4 = (this->data_->atoms).top >> 3 & 0xffffffff;
  if (uVar4 != 0) {
    pvVar1 = (this->data_->atoms).mem.beg_;
    lVar5 = 0;
    do {
      pvVar2 = *(void **)((long)pvVar1 + lVar5);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2);
      }
      lVar5 = lVar5 + 8;
    } while (uVar4 * 8 != lVar5);
  }
  pDVar3 = this->data_;
  MemoryRegion::release((MemoryRegion *)pDVar3);
  (pDVar3->atoms).top = 0;
  pDVar3 = this->data_;
  MemoryRegion::release(&(pDVar3->elems).mem);
  (pDVar3->elems).top = 0;
  pDVar3 = this->data_;
  MemoryRegion::release(&(pDVar3->terms).mem);
  (pDVar3->terms).top = 0;
  pDVar3 = this->data_;
  (pDVar3->frame).atom = 0;
  (pDVar3->frame).term = 0;
  (pDVar3->frame).elem = 0;
  return;
}

Assistant:

void TheoryData::reset() {
	DestroyT destroy;
	std::for_each(terms(), terms() + numTerms(), destroy);
	std::for_each(elems(), elems() + numElems(), destroy);
	std::for_each(atoms(), atoms() + numAtoms(), destroy);
	data_->atoms.reset();
	data_->elems.reset();
	data_->terms.reset();
	data_->frame = Data::Up();
}